

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall
TApp_IniNotRequiredNotDefault_Test::TestBody(TApp_IniNotRequiredNotDefault_Test *this)

{
  App *this_00;
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  AssertHelper local_3d0;
  int three;
  int two;
  int one;
  TempFile tmpini2;
  TempFile tmpini;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  ofstream out;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210 [3];
  string local_1f8 [32];
  undefined1 local_1d8 [448];
  
  std::__cxx11::string::string((string *)&local_238,"TestIniTmp.ini",(allocator *)&out);
  TempFile::TempFile(&tmpini,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::string((string *)&local_258,"TestIniTmp2.ini",(allocator *)&out);
  TempFile::TempFile(&tmpini2,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string((string *)&local_278,"--config",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_298,(string *)&tmpini);
  std::__cxx11::string::string((string *)&local_2b8,"Read an ini file",(allocator *)&local_3d8);
  this_00 = &(this->super_TApp).app;
  CLI::App::set_config(this_00,&local_278,&local_298,&local_2b8,false);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::ofstream::ofstream(&out,(string *)&tmpini,_S_out);
  poVar1 = std::operator<<((ostream *)&out,"[default]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&out,"two=99");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&out,"three=3");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::~ofstream(&out);
  std::ofstream::ofstream(&out,(string *)&tmpini2,_S_out);
  poVar1 = std::operator<<((ostream *)&out,"[default]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&out,"two=98");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&out,"three=4");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::~ofstream(&out);
  one = 0;
  two = 0;
  three = 0;
  std::__cxx11::string::string((string *)&local_2d8,"--one",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_2f8,"",(allocator *)&local_3d8);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_2d8,&one,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::string((string *)&local_318,"--two",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_338,"",(allocator *)&local_3d8);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_318,&two,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::string((string *)&local_358,"--three",(allocator *)&out);
  pcVar3 = "";
  std::__cxx11::string::string((string *)&local_378,"",(allocator *)&local_3d8);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_358,&three,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_358);
  TApp::run(&this->super_TApp);
  local_3d8.ptr_._0_4_ = 99;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"99","two",(int *)&local_3d8,&two);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3d8);
    if (local_210[0].ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_210[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_210);
  local_3d8.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"3","three",(int *)&local_3d8,&three);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3d8);
    if (local_210[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_210[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_210);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&out,"--config",(allocator *)&local_3d8);
  std::__cxx11::string::string(local_1f8,(string *)&tmpini2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&out,local_1d8);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&out + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  TApp::run(&this->super_TApp);
  local_3d8.ptr_._0_4_ = 0x62;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"98","two",(int *)&local_3d8,&two);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3d8);
    if (local_210[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_210[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_210);
  local_3d8.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"4","three",(int *)&local_3d8,&three);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3d8);
    if (local_210[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_210[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_210);
  TempFile::~TempFile(&tmpini2);
  TempFile::~TempFile(&tmpini);
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredNotDefault) {

    TempFile tmpini{"TestIniTmp.ini"};
    TempFile tmpini2{"TestIniTmp2.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=99" << std::endl;
        out << "three=3" << std::endl;
    }

    {
        std::ofstream out{tmpini2};
        out << "[default]" << std::endl;
        out << "two=98" << std::endl;
        out << "three=4" << std::endl;
    }

    int one = 0, two = 0, three = 0;
    app.add_option("--one", one);
    app.add_option("--two", two);
    app.add_option("--three", three);

    run();

    EXPECT_EQ(99, two);
    EXPECT_EQ(3, three);

    app.reset();
    args = {"--config", tmpini2};
    run();

    EXPECT_EQ(98, two);
    EXPECT_EQ(4, three);
}